

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O0

BufferPos * __thiscall adios2::format::MallocV::Allocate(MallocV *this,size_t size,size_t align)

{
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  size_type sVar5;
  reference pvVar6;
  long lVar7;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_RDX;
  long in_RSI;
  BufferV *in_RDI;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  size_t NewSize;
  value_type *in_stack_ffffffffffffff88;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *in_stack_ffffffffffffff90;
  vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  *pvVar12;
  BufferV *pBVar13;
  size_t local_20;
  
  if (in_RDX == (vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                 *)0x0) {
    BufferV::BufferPos::BufferPos((BufferPos *)in_RDI,-1,0,*(size_t *)(in_RSI + 0x70));
    return (BufferPos *)in_RDI;
  }
  pBVar13 = in_RDI;
  BufferV::AlignBuffer(in_RDI,(size_t)in_RDI);
  if (*(ulong *)(in_RSI + 0x88) <
      (ulong)((long)&(in_RDX->
                     super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x78))) {
    lVar7 = (long)&(in_RDX->
                   super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                   )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x78);
    auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = 0x45300000;
    uVar1 = *(undefined8 *)(in_RSI + 0x88);
    auVar11._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar11._0_8_ = uVar1;
    auVar11._12_4_ = 0x45300000;
    if ((auVar9._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) <=
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * *(double *)(in_RSI + 0x98)
       ) {
      uVar1 = *(undefined8 *)(in_RSI + 0x88);
      auVar10._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar10._0_8_ = uVar1;
      auVar10._12_4_ = 0x45300000;
      dVar8 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
              *(double *)(in_RSI + 0x98);
      uVar3 = (ulong)dVar8;
      local_20 = uVar3 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
    }
    else {
      local_20 = (long)&(in_RDX->
                        super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x78);
    }
    pvVar4 = realloc(*(void **)(in_RSI + 0x80),local_20);
    *(void **)(in_RSI + 0x80) = pvVar4;
    *(size_t *)(in_RSI + 0x88) = local_20;
  }
  sVar5 = std::
          vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
          ::size((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                  *)(in_RSI + 0x58));
  if ((sVar5 != 0) &&
     (pvVar6 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::back(in_stack_ffffffffffffff90), (pvVar6->External & 1U) == 0)) {
    lVar7 = *(long *)(in_RSI + 0x78);
    pvVar6 = std::
             vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ::back(in_stack_ffffffffffffff90);
    sVar2 = pvVar6->Offset;
    pvVar6 = std::
             vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
             ::back(in_stack_ffffffffffffff90);
    if (lVar7 == sVar2 + pvVar6->Size) {
      pvVar12 = in_RDX;
      pvVar6 = std::
               vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
               ::back(in_RDX);
      pvVar6->Size = (long)&(pvVar12->
                            super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
                            )._M_impl.super__Vector_impl_data._M_start + pvVar6->Size;
      goto LAB_00adef30;
    }
  }
  std::vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_00adef30:
  BufferV::BufferPos::BufferPos
            ((BufferPos *)in_RDI,0,*(size_t *)(in_RSI + 0x78),*(size_t *)(in_RSI + 0x70));
  *(long *)(in_RSI + 0x70) =
       (long)&(in_RDX->
              super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
              )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x70);
  *(long *)(in_RSI + 0x78) =
       (long)&(in_RDX->
              super__Vector_base<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
              )._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RSI + 0x78);
  return (BufferPos *)pBVar13;
}

Assistant:

BufferV::BufferPos MallocV::Allocate(const size_t size, size_t align)
{
    if (size == 0)
    {
        return BufferPos(-1, 0, CurOffset);
    }

    AlignBuffer(align);

    if (m_internalPos + size > m_AllocatedSize)
    {
        // need to resize
        size_t NewSize;
        if (m_internalPos + size > m_AllocatedSize * m_GrowthFactor)
        {
            // just grow as needed (more than GrowthFactor)
            NewSize = m_internalPos + size;
        }
        else
        {
            NewSize = (size_t)(m_AllocatedSize * m_GrowthFactor);
        }
        m_InternalBlock = (char *)realloc(m_InternalBlock, NewSize);
        m_AllocatedSize = NewSize;
    }

    if (DataV.size() && !DataV.back().External &&
        (m_internalPos == (DataV.back().Offset + DataV.back().Size)))
    {
        // just add to the size of the existing tail entry
        DataV.back().Size += size;
    }
    else
    {
        DataV.push_back({false, NULL, m_internalPos, size});
    }

    BufferPos bp(0, m_internalPos, CurOffset);
    // valid ptr anytime <-- m_InternalBlock + m_internalPos;

    CurOffset += size;
    m_internalPos += size;

    return bp;
}